

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

char * ImGui::TableGetColumnName(int column_n)

{
  ImGuiTable *table;
  ImGuiContext *g;
  char *local_8;
  
  if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = TableGetColumnName((ImGuiTable *)GImGui,(int)((ulong)GImGui->CurrentTable >> 0x20));
  }
  return local_8;
}

Assistant:

const char*   ImGui::TableGetColumnName(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return NULL;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    return TableGetColumnName(table, column_n);
}